

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

void __thiscall QRegularExpressionPrivate::compilePattern(QRegularExpressionPrivate *this)

{
  uint uVar1;
  pcre2_code_16 *ppVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  size_t patternErrorOffset;
  undefined1 *local_30;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._0_8_ = &this->mutex;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_28._0_8_);
  local_28[8] = true;
  if (this->isDirty == true) {
    this->isDirty = false;
    cleanCompiledPattern(this);
    uVar1 = (this->patternOptions).super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
            super_QFlagsStorage<QRegularExpression::PatternOption>.i;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    pcVar3 = (this->pattern).d.ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = L"";
    }
    ppVar2 = (pcre2_code_16 *)
             pcre2_compile_16(pcVar3,(this->pattern).d.size,
                              (uVar1 << 4 & 0x20) + (uVar1 & 1) * 8 | uVar1 << 8 & 0x400 |
                              uVar1 << 4 & 0x80 | (uVar1 & 0x10) << 0xe | uVar1 << 8 & 0x2000 |
                              (uVar1 & 0x40) << 0xb | 0x80000,&this->errorCode,&local_30,0);
    this->compiledPattern = ppVar2;
    if (ppVar2 == (pcre2_code_16 *)0x0) {
      this->errorOffset = (qsizetype)local_30;
    }
    else {
      this->errorCode = 0;
      optimizePattern(this);
      getPatternInfo(this);
    }
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRegularExpressionPrivate::compilePattern()
{
    const QMutexLocker lock(&mutex);

    if (!isDirty)
        return;

    isDirty = false;
    cleanCompiledPattern();

    int options = convertToPcreOptions(patternOptions);
    options |= PCRE2_UTF;

    PCRE2_SIZE patternErrorOffset;
    compiledPattern = pcre2_compile_16(reinterpret_cast<PCRE2_SPTR16>(pattern.constData()),
                                       pattern.size(),
                                       options,
                                       &errorCode,
                                       &patternErrorOffset,
                                       nullptr);

    if (!compiledPattern) {
        errorOffset = qsizetype(patternErrorOffset);
        return;
    } else {
        // ignore whatever PCRE2 wrote into errorCode -- leave it to 0 to mean "no error"
        errorCode = 0;
    }

    optimizePattern();
    getPatternInfo();
}